

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall QGraphicsScenePrivate::updatePalette(QGraphicsScenePrivate *this,QPalette *palette)

{
  QObject *pQVar1;
  long *plVar2;
  QGraphicsItem *this_00;
  QGraphicsItemPrivate *pQVar3;
  long lVar4;
  uint uVar5;
  QGraphicsItem *pQVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  QPalette::operator=(&this->palette,palette);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d._0_4_ = 0xaaaaaaaa;
  local_58.d._4_4_ = 0xaaaaaaaa;
  local_58.ptr._0_4_ = 0xaaaaaaaa;
  local_58.ptr._4_4_ = 0xaaaaaaaa;
  plVar2 = *(long **)(*(long *)(pQVar1 + 8) + 0x88);
  (**(code **)(*plVar2 + 0x60))(&local_58,plVar2,1);
  lVar4 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
  lVar8 = local_58.size << 3;
  for (lVar7 = 0; lVar8 != lVar7; lVar7 = lVar7 + 8) {
    this_00 = *(QGraphicsItem **)(lVar4 + lVar7);
    pQVar6 = QGraphicsItem::parentItem(this_00);
    if (pQVar6 == (QGraphicsItem *)0x0) {
      pQVar3 = (this_00->d_ptr).d;
      uVar5 = QPalette::resolveMask();
      (*pQVar3->_vptr_QGraphicsItemPrivate[6])(pQVar3,(ulong)uVar5);
    }
  }
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_68,PaletteChange);
  QCoreApplication::sendEvent(pQVar1,(QEvent *)&local_68);
  QEvent::~QEvent((QEvent *)&local_68);
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::updatePalette(const QPalette &palette)
{
    Q_Q(QGraphicsScene);

    // Update local palette setting.
    this->palette = palette;

    // Resolve the palettes of all top-level widget items, or widget items
    // whose parent is not a widget.
    const auto items = q->items();
    for (QGraphicsItem *item : items) {
        if (!item->parentItem()) {
            // ResolvePalette for an item is a noop operation, but
            // every item can be a widget, or can have a widget
            // children.
            item->d_ptr->resolvePalette(palette.resolveMask());
        }
    }

    // Send the scene a PaletteChange event.
    QEvent event(QEvent::PaletteChange);
    QCoreApplication::sendEvent(q, &event);
}